

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_8::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  Slice *in_RDI;
  Iterator *iter;
  Slice handle;
  string *in_stack_ffffffffffffffa8;
  Slice *in_stack_ffffffffffffffb0;
  size_t *psVar4;
  Iterator *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar5;
  Slice *in_stack_ffffffffffffffd0;
  Slice local_18;
  
  bVar1 = IteratorWrapper::Valid((IteratorWrapper *)&in_RDI[5].size_);
  if (bVar1) {
    local_18 = IteratorWrapper::value((IteratorWrapper *)0x10e8a1);
    pIVar3 = IteratorWrapper::iter((IteratorWrapper *)&in_RDI[7].size_);
    uVar5 = false;
    if (pIVar3 != (Iterator *)0x0) {
      Slice::Slice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      iVar2 = Slice::compare(in_stack_ffffffffffffffd0,in_RDI);
      uVar5 = iVar2 == 0;
    }
    if ((bool)uVar5 == false) {
      (*(code *)in_RDI[2].size_)(in_RDI[3].data_,&in_RDI[3].size_,&local_18);
      psVar4 = &in_RDI[9].size_;
      pIVar3 = (Iterator *)Slice::data(&local_18);
      Slice::size(&local_18);
      std::__cxx11::string::assign((char *)psVar4,(ulong)pIVar3);
      SetDataIterator((TwoLevelIterator *)CONCAT17(uVar5,in_stack_ffffffffffffffc0),pIVar3);
    }
  }
  else {
    SetDataIterator((TwoLevelIterator *)
                    CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}